

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O2

int psmem_mrd(nettlp *nt,tlp_mr_hdr *mh,void *arg)

{
  ushort uVar1;
  int iVar2;
  uintptr_t uVar3;
  ssize_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint local_8c;
  ushort local_88;
  ushort local_86;
  uint16_t local_84;
  uint8_t local_82;
  byte local_81;
  nettlp_hdr nh;
  iovec iov [3];
  
  usleep(mrd_sleep);
  iov[0].iov_base = &nh;
  iov[0].iov_len = 6;
  iov[1].iov_base = &local_8c;
  iov[1].iov_len = 0xc;
  uVar1 = (mh->tlp).falen;
  uVar3 = tlp_mr_addr(mh);
  iVar2 = tlp_mr_data_length(mh);
  lVar7 = (long)iVar2;
  if (nostdout == '\0') {
    fprintf(_stdout,"%s: MRd to 0x%lx, tag 0x%02x %lu byte\n","psmem_mrd",uVar3 & 0xfffffffffffffffc
            ,(ulong)mh->tag,lVar7);
  }
  if ((uVar3 < *arg) ||
     (uVar6 = (ulong)(((ushort)(uVar1 << 8 | uVar1 >> 8) & 0x3ff) << 2),
     *arg + *(long *)((long)arg + 8) < uVar3 + uVar6)) {
    fprintf(_stderr,"%s:ERR: MRd request to 0x%lx, stick out of the pseudo memory region\n",
            "psmem_mrd",uVar3);
    iVar2 = -1;
  }
  else {
    do {
      uVar5 = 0x100;
      if ((long)uVar6 < 0x100) {
        uVar5 = uVar6;
      }
      nh.tstamp._2_2_ = 0;
      nh._0_4_ = 0;
      uVar1 = (ushort)(uVar5 >> 2);
      local_8c = CONCAT22(uVar1 << 8 | (uVar1 | SUB42(mh->tlp,1) & 0xfc00) >> 8,SUB42(mh->tlp,0)) &
                 0xffffff80 | 0x4a;
      local_86 = (ushort)lVar7 << 8 | (ushort)lVar7 >> 8;
      local_88 = nt->requester << 8 | nt->requester >> 8;
      local_84 = mh->requester;
      local_82 = mh->tag;
      local_81 = (byte)uVar3 & 0x7f;
      iov[2].iov_base =
           (void *)(((uVar3 & 0xfffffffffffffffc) - *arg) + *(long *)((long)arg + 0x10));
      iov[2].iov_len = uVar5;
      sVar4 = writev(nt->sockfd,(iovec *)iov,3);
      if ((int)sVar4 < 0) {
        fprintf(_stderr,"%s:ERR: writev failed\n","psmem_mrd");
        perror("writev");
      }
      uVar6 = uVar6 - uVar5;
      lVar7 = lVar7 + (((uint)uVar3 & 3) - uVar5);
      uVar3 = (uVar3 & 0xfffffffffffffffc) + uVar5;
    } while (0 < lVar7);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int psmem_mrd(struct nettlp *nt, struct tlp_mr_hdr *mh, void *arg)
{
	int ret;
	struct psmem *p = arg;
	ssize_t len, data_len;
	uintptr_t addr;
	struct nettlp_hdr nh;
	struct tlp_cpl_hdr ch;
	struct iovec iov[3];

	usleep(mrd_sleep);

	/* CplD packet */
	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &ch;
	iov[1].iov_len = sizeof(ch);

	len = tlp_length(mh->tlp.falen) << 2;
	addr = tlp_mr_addr(mh);
	data_len = tlp_mr_data_length(mh);	/* actuary transfer data len */

	pr_info("MRd to 0x%lx, tag 0x%02x %lu byte\n",
		(addr >> 2) << 2, mh->tag, data_len);

	if (addr < p->addr || addr + len > p->addr + p->size) {
		pr_err("MRd request to 0x%lx, "
		       "stick out of the pseudo memory region\n", addr);
		send_cpl_abort(nt, mh);
		return -1;
	}

	do {
		ssize_t send_len;
		send_len = len < MAXPAYLOADSIZE ? len : MAXPAYLOADSIZE;
		
		memset(&nh, 0, sizeof(nh));
		memset(&ch, 0, sizeof(ch));

		/* XXX: copy flag and attribute. should handle properly */
		memcpy(&ch.tlp, &mh->tlp, sizeof(struct tlp_hdr));

		/* Build CplD header */
		tlp_set_fmt(ch.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_W_DATA);
		tlp_set_type(ch.tlp.fmt_type, TLP_TYPE_Cpl);
		tlp_set_length(ch.tlp.falen, send_len >> 2);
		tlp_set_cpl_status(ch.stcnt, TLP_CPL_STATUS_SC);
		tlp_set_cpl_bcnt(ch.stcnt, data_len);
		ch.completer = htons(nt->requester);
		ch.requester = mh->requester;
		ch.tag = mh->tag;
		ch.lowaddr = addr & 0x7F;

		/* memory to be sent */
		iov[2].iov_base = p->mem + (((addr >> 2) << 2) - p->addr);
		iov[2].iov_len = send_len;

		ret = writev(nt->sockfd, iov, 3);
		if (ret < 0) {
			pr_err("writev failed\n");
			perror("writev");
		}

		len -= send_len;
		data_len -= send_len - (addr & 0x3);
		addr = ((addr >> 2) << 2) + send_len;

	} while (data_len > 0);

	return 0;
}